

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io.c
# Opt level: O1

int gdGetByte(int *result,gdIOCtx *ctx)

{
  int iVar1;
  
  iVar1 = (*ctx->getC)(ctx);
  if (iVar1 != -1) {
    *result = iVar1;
  }
  return (uint)(iVar1 != -1);
}

Assistant:

int gdGetByte(int *result, gdIOCtx *ctx)
{
	int r;

	r = (ctx->getC)(ctx);
	if(r == EOF) {
		return 0;
	}

	*result = r;

	return 1;
}